

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O0

void google::protobuf::compiler::rust::GenerateOneofThunkCc(Context *ctx,OneofDescriptor *oneof)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 ctx_00;
  OneofDescriptor *pOVar1;
  OneofDescriptor *this;
  bool bVar2;
  LogMessage *pLVar3;
  DescriptorStringView value;
  Descriptor *this_00;
  OneofDescriptor *oneof_00;
  Descriptor *d;
  char *in_R9;
  string_view op;
  Sub *local_508;
  basic_string_view<char,_std::char_traits<char>_> local_488;
  undefined1 local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  basic_string_view<char,_std::char_traits<char>_> local_428;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  Sub *local_360;
  Sub local_358;
  Sub local_2a0;
  Sub local_1e8;
  Sub local_130;
  iterator local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_68 [2];
  undefined1 local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19 [9];
  OneofDescriptor *oneof_local;
  Context *ctx_local;
  
  local_19._1_8_ = oneof;
  oneof_local = (OneofDescriptor *)ctx;
  bVar2 = Context::is_cpp(ctx);
  local_41 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"ctx.is_cpp()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/oneof.cc"
               ,0x122,local_40._M_len,local_40._M_str);
    local_41 = 1;
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(local_19,pLVar3);
  }
  pOVar1 = oneof_local;
  if ((local_41 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  local_471 = 1;
  local_360 = &local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"oneof_name",&local_381);
  value = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)local_19._1_8_);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_358,&local_380,value);
  local_360 = &local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"case_enum_name",&local_3a9);
  OneofCaseEnumRsName_abi_cxx11_(&local_3d0,(rust *)local_19._1_8_,oneof_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_2a0,&local_3a8,&local_3d0);
  local_360 = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"case_thunk",&local_3f1);
  this = oneof_local;
  ctx_00 = local_19._1_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_428,"case");
  op._M_str = in_R9;
  op._M_len = (size_t)local_428._M_str;
  ThunkName_abi_cxx11_
            (&local_418,(rust *)this,(Context *)ctx_00,(OneofDescriptor *)local_428._M_len,op);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1e8,&local_3f0,&local_418);
  local_360 = &local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"QualifiedMsg",&local_449)
  ;
  this_00 = OneofDescriptor::containing_type((OneofDescriptor *)local_19._1_8_);
  cpp::QualifiedClassName_abi_cxx11_(&local_470,(cpp *)this_00,d);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_130,&local_448,&local_470);
  local_471 = 0;
  local_78 = &local_358;
  local_70 = 4;
  v._M_len = 4;
  v._M_array = local_78;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_68[0]._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_488,
             "\n        $QualifiedMsg$::$case_enum_name$ $case_thunk$($QualifiedMsg$* msg) {\n          return msg->$oneof_name$_case();\n        }\n      "
            );
  io::Printer::SourceLocation::current();
  Context::Emit((Context *)pOVar1,local_68[0]._M_allocated_capacity,local_68[0]._8_8_,
                local_488._M_len,local_488._M_str);
  local_508 = (Sub *)&local_78;
  do {
    local_508 = local_508 + -1;
    io::Printer::Sub::~Sub(local_508);
  } while (local_508 != &local_358);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  return;
}

Assistant:

void GenerateOneofThunkCc(Context& ctx, const OneofDescriptor& oneof) {
  ABSL_CHECK(ctx.is_cpp());

  ctx.Emit(
      {
          {"oneof_name", oneof.name()},
          {"case_enum_name", OneofCaseEnumRsName(oneof)},
          {"case_thunk", ThunkName(ctx, oneof, "case")},
          {"QualifiedMsg", cpp::QualifiedClassName(oneof.containing_type())},
      },
      R"cc(
        $QualifiedMsg$::$case_enum_name$ $case_thunk$($QualifiedMsg$* msg) {
          return msg->$oneof_name$_case();
        }
      )cc");
}